

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidgetPrivate::updateIsTranslucent(QWidgetPrivate *this)

{
  long lVar1;
  QSurfaceFormat *pQVar2;
  uint uVar3;
  long lVar4;
  long in_FS_OFFSET;
  QSurfaceFormat format;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)&this->field_0x8;
  lVar1 = *(long *)(*(long *)(lVar4 + 8) + 0x78);
  if (((lVar1 != 0) && (lVar1 = *(long *)(lVar1 + 8), lVar1 != 0)) &&
     (pQVar2 = *(QSurfaceFormat **)(lVar1 + 0x20), pQVar2 != (QSurfaceFormat *)0x0)) {
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)pQVar2 + 0x68))(&local_30,pQVar2);
    uVar3 = QSurfaceFormat::alphaBufferSize();
    if (uVar3 != (-(uint)((*(byte *)(*(long *)(lVar4 + 8) + 0x24b) & 1) == 0) | 8)) {
      lVar4 = QWindow::handle();
      if (lVar4 == 0) {
        QSurfaceFormat::setAlphaBufferSize((int)&local_30);
        QWindow::setFormat(pQVar2);
      }
    }
    QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::updateIsTranslucent()
{
    Q_Q(QWidget);
    if (QWindow *window = q->windowHandle()) {
        QSurfaceFormat format = window->format();
        const int oldAlpha = format.alphaBufferSize();
        const int newAlpha = q->testAttribute(Qt::WA_TranslucentBackground) ? 8 : -1;
        if (oldAlpha != newAlpha) {
            // QTBUG-85714: Do this only when the QWindow has not yet been create()'ed yet.
            //
            // If that is not the case, then the setFormat() is not just futile
            // but downright dangerous. Futile because the format matters only
            // when creating the native window, no point in changing it
            // afterwards. Dangerous because a QOpenGLContext or something else
            // may eventually query the QWindow's format(), in order to ensure
            // compatibility (in terms of native concepts such as pixel format,
            // EGLConfig, etc.), and if we change it here, then the returned
            // format does not describe reality anymore. (reality being the
            // settings with which the native resource was created).
            //
            // Whereas if one does a destroy()-create() then this all here
            // won't matter because the format is updated in
            // QWidgetPrivate::create() again.
            //
            if (!window->handle()) {
                format.setAlphaBufferSize(newAlpha);
                window->setFormat(format);
            }
        }
    }
}